

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.c
# Opt level: O2

char * generate_arg_str(sm_ref net)

{
  cod_node_type cVar1;
  char *__s;
  char *__ptr;
  size_t sVar2;
  char cVar3;
  sm_ref psVar4;
  ulong uVar5;
  list_struct *plVar6;
  int param_num;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  __s = (char *)malloc(4);
  __ptr = (char *)malloc(1);
  uVar9 = 0;
  if (net->node_type == cod_compound_statement) {
    plVar6 = (net->node).compound_statement.decls;
  }
  else {
    plVar6 = (sm_list)0x0;
  }
  *__s = '\0';
  do {
    uVar8 = (uint)uVar9;
    if (plVar6 == (sm_list)0x0) {
      if (uVar8 == 1) {
        uVar8 = (uint)(*__ptr != '\v');
      }
      uVar5 = 0;
      uVar9 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar9 = uVar5;
      }
      while( true ) {
        if (uVar9 == uVar5) {
          free(__ptr);
          return __s;
        }
        if (__ptr[uVar5] == -1) break;
        sVar2 = strlen(__s);
        sVar2 = sVar2 + 8;
        __s = (char *)realloc(__s,sVar2);
        strncat(__s,"%",sVar2);
        strncat(__s,arg_type_str_rel + *(int *)(arg_type_str_rel + (long)__ptr[uVar5] * 4),sVar2);
        uVar5 = uVar5 + 1;
      }
      printf("Arg %d not declared\n",uVar5 & 0xffffffff);
      return __s;
    }
    psVar4 = plVar6->node;
    cVar1 = psVar4->node_type;
    uVar5 = uVar9 & 0xffffffff;
    if (cVar1 == cod_declaration) {
      uVar7 = (psVar4->node).declaration.param_num;
      if ((ulong)uVar7 != 0xffffffff) {
        if ((int)uVar8 <= (int)uVar7) {
          uVar9 = (ulong)uVar7 + 1;
          __ptr = (char *)realloc(__ptr,uVar9);
          memset(__ptr + uVar5,0xff,(long)(int)(uVar7 - uVar8));
        }
        cVar3 = *(char *)((long)&psVar4->node + 100);
LAB_001221dd:
        __ptr[(int)uVar7] = cVar3;
      }
    }
    else if (cVar1 == cod_array_type_decl) {
      while (cVar1 == cod_array_type_decl) {
        psVar4 = (psVar4->node).declaration.freeable_complex_type;
        cVar1 = psVar4->node_type;
      }
      uVar7 = (psVar4->node).declaration.param_num;
      if ((ulong)uVar7 != 0xffffffff) {
        cVar3 = '\b';
        if ((int)uVar8 <= (int)uVar7) {
          uVar9 = (ulong)uVar7 + 1;
          __ptr = (char *)realloc(__ptr,uVar9);
          memset(__ptr + uVar5,0xff,(long)(int)(uVar7 - uVar8));
        }
        goto LAB_001221dd;
      }
    }
    plVar6 = plVar6->next;
  } while( true );
}

Assistant:

char *
generate_arg_str(sm_ref net)
{
    sm_list decls = NULL;
    char *arg_str = malloc(4);  /* 4 makes valgrind happier */
    signed char *arg_types = malloc(1);
    int arg_count = 0;
    int i;
    if (net->node_type == cod_compound_statement) {
	decls = net->node.compound_statement.decls;
    }
    arg_str[0] = 0;
    while (decls != NULL) {
	sm_ref decl = decls->node;
	
	if (decl->node_type == cod_declaration) {
	    if (decl->node.declaration.param_num != -1) {
		/* parameter */
		int param_num = decl->node.declaration.param_num;
		if (param_num >= arg_count) {
		    arg_types = realloc(arg_types, param_num + 1);
		    memset(arg_types + arg_count, -1, 
			   param_num - arg_count);
		    arg_count = param_num + 1;
		}
		arg_types[param_num] = decl->node.declaration.cg_type;
	    }
	} else if (decl->node_type == cod_array_type_decl) {
	    while(decl->node_type == cod_array_type_decl)
		decl = decl->node.array_type_decl.element_ref;
	    if (decl->node.declaration.param_num != -1) {
		int param_num = decl->node.declaration.param_num;
		if (param_num >= arg_count) {
		    arg_types = realloc(arg_types, param_num + 1);
		    memset(arg_types + arg_count, -1, 
			   param_num - arg_count);
		    arg_count = param_num + 1;
		}
		arg_types[param_num] = DILL_P;
	    }
	}
	    
	decls = decls->next;
    }
    if ((arg_count == 1) && (arg_types[0] == DILL_V)) {
	arg_count = 0;
    }
    for (i = 0; i < arg_count ; i++) {
	size_t len;
	if (arg_types[i] == -1) {
	    printf("Arg %d not declared\n", i);
	    return arg_str;
	}
	len = strlen(arg_str) + 8;
	arg_str = realloc(arg_str, len);
	strncat(arg_str, "%", len);
	strncat(arg_str, arg_type_str[arg_types[i]], len);
    }
    free(arg_types);
    return arg_str;
}